

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::MatrixMultiply::backward_impl
          (MatrixMultiply *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  pointer ppTVar5;
  Tensor *pTVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  byte bVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  char *pcVar15;
  ulong uVar16;
  uint uVar17;
  ushort uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  int iVar34;
  int iVar35;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_b0;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_90;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  if (1 < i) {
    __assert_fail("i < 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                  ,0x595,
                  "virtual void cnn::MatrixMultiply::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  ppTVar5 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar6 = *ppTVar5;
  uVar14 = (pTVar6->d).bd;
  uVar17 = (ppTVar5[1]->d).bd;
  if (uVar17 < uVar14) {
    uVar17 = uVar14;
  }
  if (i == 0) {
    if (0 < (int)uVar17) {
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar14 = 0;
      do {
        uVar2 = (dEdf->d).nd;
        iVar34 = 1;
        if ((ulong)uVar2 != 0) {
          auVar25 = vpbroadcastd_avx512f(ZEXT416(1));
          auVar26 = vpbroadcastq_avx512f();
          uVar16 = 0;
          do {
            auVar27 = vpbroadcastq_avx512f();
            auVar28 = vmovdqa64_avx512f(auVar25);
            auVar25 = vporq_avx512f(auVar27,auVar23);
            auVar27 = vporq_avx512f(auVar27,auVar24);
            uVar10 = vpcmpuq_avx512f(auVar27,auVar26,2);
            bVar11 = (byte)uVar10;
            uVar10 = vpcmpuq_avx512f(auVar25,auVar26,2);
            bVar12 = (byte)uVar10;
            uVar18 = CONCAT11(bVar12,bVar11);
            auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar16));
            auVar27._4_4_ = (uint)((byte)(uVar18 >> 1) & 1) * auVar25._4_4_;
            auVar27._0_4_ = (uint)(bVar11 & 1) * auVar25._0_4_;
            auVar27._8_4_ = (uint)((byte)(uVar18 >> 2) & 1) * auVar25._8_4_;
            auVar27._12_4_ = (uint)((byte)(uVar18 >> 3) & 1) * auVar25._12_4_;
            auVar27._16_4_ = (uint)((byte)(uVar18 >> 4) & 1) * auVar25._16_4_;
            auVar27._20_4_ = (uint)((byte)(uVar18 >> 5) & 1) * auVar25._20_4_;
            auVar27._24_4_ = (uint)((byte)(uVar18 >> 6) & 1) * auVar25._24_4_;
            auVar27._28_4_ = (uint)((byte)(uVar18 >> 7) & 1) * auVar25._28_4_;
            auVar27._32_4_ = (uint)(bVar12 & 1) * auVar25._32_4_;
            auVar27._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar25._36_4_;
            auVar27._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar25._40_4_;
            auVar27._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar25._44_4_;
            auVar27._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar25._48_4_;
            auVar27._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar25._52_4_;
            auVar27._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar25._56_4_;
            auVar27._60_4_ = (uint)(bVar12 >> 7) * auVar25._60_4_;
            uVar16 = uVar16 + 0x10;
            auVar25 = vpmulld_avx512f(auVar27,auVar28);
          } while (((ulong)uVar2 + 0xf & 0x1fffffff0) != uVar16);
          auVar25 = vmovdqa32_avx512f(auVar25);
          auVar26._0_4_ =
               (uint)(bVar11 & 1) * auVar25._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar28._0_4_;
          bVar7 = (bool)((byte)(uVar18 >> 1) & 1);
          auVar26._4_4_ = (uint)bVar7 * auVar25._4_4_ | (uint)!bVar7 * auVar28._4_4_;
          bVar7 = (bool)((byte)(uVar18 >> 2) & 1);
          auVar26._8_4_ = (uint)bVar7 * auVar25._8_4_ | (uint)!bVar7 * auVar28._8_4_;
          bVar7 = (bool)((byte)(uVar18 >> 3) & 1);
          auVar26._12_4_ = (uint)bVar7 * auVar25._12_4_ | (uint)!bVar7 * auVar28._12_4_;
          bVar7 = (bool)((byte)(uVar18 >> 4) & 1);
          auVar26._16_4_ = (uint)bVar7 * auVar25._16_4_ | (uint)!bVar7 * auVar28._16_4_;
          bVar7 = (bool)((byte)(uVar18 >> 5) & 1);
          auVar26._20_4_ = (uint)bVar7 * auVar25._20_4_ | (uint)!bVar7 * auVar28._20_4_;
          bVar7 = (bool)((byte)(uVar18 >> 6) & 1);
          auVar26._24_4_ = (uint)bVar7 * auVar25._24_4_ | (uint)!bVar7 * auVar28._24_4_;
          bVar7 = (bool)((byte)(uVar18 >> 7) & 1);
          auVar26._28_4_ = (uint)bVar7 * auVar25._28_4_ | (uint)!bVar7 * auVar28._28_4_;
          auVar26._32_4_ =
               (uint)(bVar12 & 1) * auVar25._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar28._32_4_;
          bVar7 = (bool)(bVar12 >> 1 & 1);
          auVar26._36_4_ = (uint)bVar7 * auVar25._36_4_ | (uint)!bVar7 * auVar28._36_4_;
          bVar7 = (bool)(bVar12 >> 2 & 1);
          auVar26._40_4_ = (uint)bVar7 * auVar25._40_4_ | (uint)!bVar7 * auVar28._40_4_;
          bVar7 = (bool)(bVar12 >> 3 & 1);
          auVar26._44_4_ = (uint)bVar7 * auVar25._44_4_ | (uint)!bVar7 * auVar28._44_4_;
          bVar7 = (bool)(bVar12 >> 4 & 1);
          auVar26._48_4_ = (uint)bVar7 * auVar25._48_4_ | (uint)!bVar7 * auVar28._48_4_;
          bVar7 = (bool)(bVar12 >> 5 & 1);
          auVar26._52_4_ = (uint)bVar7 * auVar25._52_4_ | (uint)!bVar7 * auVar28._52_4_;
          bVar7 = (bool)(bVar12 >> 6 & 1);
          auVar26._56_4_ = (uint)bVar7 * auVar25._56_4_ | (uint)!bVar7 * auVar28._56_4_;
          auVar26._60_4_ =
               (uint)(bVar12 >> 7) * auVar25._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar28._60_4_;
          auVar19 = vextracti64x4_avx512f(auVar26,1);
          auVar25 = vpmulld_avx512f(auVar26,ZEXT3264(auVar19));
          auVar8 = vpmulld_avx(auVar25._0_16_,auVar25._16_16_);
          auVar9 = vpshufd_avx(auVar8,0xee);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          auVar9 = vpshufd_avx(auVar8,0x55);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          iVar34 = auVar8._0_4_;
        }
        iVar35 = 1;
        pTVar6 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)
                 ._M_impl.super__Vector_impl_data._M_start[1];
        uVar3 = (dEdf->d).d[1];
        if (uVar2 < 2) {
          uVar3 = 1;
        }
        local_b0.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)uVar3;
        uVar2 = (pTVar6->d).nd;
        if ((ulong)uVar2 != 0) {
          auVar25 = vpbroadcastd_avx512f(ZEXT416(1));
          auVar26 = vpbroadcastq_avx512f();
          uVar16 = 0;
          do {
            auVar27 = vpbroadcastq_avx512f();
            auVar28 = vmovdqa64_avx512f(auVar25);
            auVar25 = vporq_avx512f(auVar27,auVar23);
            auVar27 = vporq_avx512f(auVar27,auVar24);
            uVar10 = vpcmpuq_avx512f(auVar27,auVar26,2);
            bVar11 = (byte)uVar10;
            uVar10 = vpcmpuq_avx512f(auVar25,auVar26,2);
            bVar12 = (byte)uVar10;
            uVar18 = CONCAT11(bVar12,bVar11);
            auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar6->d).d + uVar16));
            auVar20._4_4_ = (uint)((byte)(uVar18 >> 1) & 1) * auVar25._4_4_;
            auVar20._0_4_ = (uint)(bVar11 & 1) * auVar25._0_4_;
            auVar20._8_4_ = (uint)((byte)(uVar18 >> 2) & 1) * auVar25._8_4_;
            auVar20._12_4_ = (uint)((byte)(uVar18 >> 3) & 1) * auVar25._12_4_;
            auVar20._16_4_ = (uint)((byte)(uVar18 >> 4) & 1) * auVar25._16_4_;
            auVar20._20_4_ = (uint)((byte)(uVar18 >> 5) & 1) * auVar25._20_4_;
            auVar20._24_4_ = (uint)((byte)(uVar18 >> 6) & 1) * auVar25._24_4_;
            auVar20._28_4_ = (uint)((byte)(uVar18 >> 7) & 1) * auVar25._28_4_;
            auVar20._32_4_ = (uint)(bVar12 & 1) * auVar25._32_4_;
            auVar20._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar25._36_4_;
            auVar20._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar25._40_4_;
            auVar20._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar25._44_4_;
            auVar20._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar25._48_4_;
            auVar20._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar25._52_4_;
            auVar20._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar25._56_4_;
            auVar20._60_4_ = (uint)(bVar12 >> 7) * auVar25._60_4_;
            uVar16 = uVar16 + 0x10;
            auVar25 = vpmulld_avx512f(auVar20,auVar28);
          } while (((ulong)uVar2 + 0xf & 0x1fffffff0) != uVar16);
          auVar25 = vmovdqa32_avx512f(auVar25);
          auVar21._0_4_ =
               (uint)(bVar11 & 1) * auVar25._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar28._0_4_;
          bVar7 = (bool)((byte)(uVar18 >> 1) & 1);
          auVar21._4_4_ = (uint)bVar7 * auVar25._4_4_ | (uint)!bVar7 * auVar28._4_4_;
          bVar7 = (bool)((byte)(uVar18 >> 2) & 1);
          auVar21._8_4_ = (uint)bVar7 * auVar25._8_4_ | (uint)!bVar7 * auVar28._8_4_;
          bVar7 = (bool)((byte)(uVar18 >> 3) & 1);
          auVar21._12_4_ = (uint)bVar7 * auVar25._12_4_ | (uint)!bVar7 * auVar28._12_4_;
          bVar7 = (bool)((byte)(uVar18 >> 4) & 1);
          auVar21._16_4_ = (uint)bVar7 * auVar25._16_4_ | (uint)!bVar7 * auVar28._16_4_;
          bVar7 = (bool)((byte)(uVar18 >> 5) & 1);
          auVar21._20_4_ = (uint)bVar7 * auVar25._20_4_ | (uint)!bVar7 * auVar28._20_4_;
          bVar7 = (bool)((byte)(uVar18 >> 6) & 1);
          auVar21._24_4_ = (uint)bVar7 * auVar25._24_4_ | (uint)!bVar7 * auVar28._24_4_;
          bVar7 = (bool)((byte)(uVar18 >> 7) & 1);
          auVar21._28_4_ = (uint)bVar7 * auVar25._28_4_ | (uint)!bVar7 * auVar28._28_4_;
          auVar21._32_4_ =
               (uint)(bVar12 & 1) * auVar25._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar28._32_4_;
          bVar7 = (bool)(bVar12 >> 1 & 1);
          auVar21._36_4_ = (uint)bVar7 * auVar25._36_4_ | (uint)!bVar7 * auVar28._36_4_;
          bVar7 = (bool)(bVar12 >> 2 & 1);
          auVar21._40_4_ = (uint)bVar7 * auVar25._40_4_ | (uint)!bVar7 * auVar28._40_4_;
          bVar7 = (bool)(bVar12 >> 3 & 1);
          auVar21._44_4_ = (uint)bVar7 * auVar25._44_4_ | (uint)!bVar7 * auVar28._44_4_;
          bVar7 = (bool)(bVar12 >> 4 & 1);
          auVar21._48_4_ = (uint)bVar7 * auVar25._48_4_ | (uint)!bVar7 * auVar28._48_4_;
          bVar7 = (bool)(bVar12 >> 5 & 1);
          auVar21._52_4_ = (uint)bVar7 * auVar25._52_4_ | (uint)!bVar7 * auVar28._52_4_;
          bVar7 = (bool)(bVar12 >> 6 & 1);
          auVar21._56_4_ = (uint)bVar7 * auVar25._56_4_ | (uint)!bVar7 * auVar28._56_4_;
          auVar21._60_4_ =
               (uint)(bVar12 >> 7) * auVar25._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar28._60_4_;
          auVar19 = vextracti64x4_avx512f(auVar21,1);
          auVar25 = vpmulld_avx512f(auVar21,ZEXT3264(auVar19));
          auVar8 = vpmulld_avx(auVar25._0_16_,auVar25._16_16_);
          auVar9 = vpshufd_avx(auVar8,0xee);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          auVar9 = vpshufd_avx(auVar8,0x55);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          iVar35 = auVar8._0_4_;
        }
        uVar4 = (dEdf->d).d[0];
        local_b0.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar4;
        local_b0.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = dEdf->v + (uVar14 % (dEdf->d).bd) * iVar34;
        uVar1 = (pTVar6->d).d[0];
        local_90.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar1;
        local_90.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = pTVar6->v + (uVar14 % (pTVar6->d).bd) * iVar35;
        local_90.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)(pTVar6->d).d[1];
        if (uVar2 < 2) {
          local_90.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = 1;
        }
        if (uVar3 != (uint)local_90.
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_cols.m_value) {
          pcVar15 = 
          "Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Rhs = Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Option = 0]"
          ;
          goto LAB_001812e2;
        }
        uVar2 = (dEdxi->d).nd;
        if ((ulong)uVar2 == 0) {
          iVar34 = 1;
        }
        else {
          auVar25 = vpbroadcastd_avx512f(ZEXT416(1));
          auVar26 = vpbroadcastq_avx512f();
          uVar16 = 0;
          do {
            auVar27 = vpbroadcastq_avx512f();
            auVar28 = vmovdqa64_avx512f(auVar25);
            auVar25 = vporq_avx512f(auVar27,auVar23);
            auVar27 = vporq_avx512f(auVar27,auVar24);
            uVar10 = vpcmpuq_avx512f(auVar27,auVar26,2);
            bVar11 = (byte)uVar10;
            uVar10 = vpcmpuq_avx512f(auVar25,auVar26,2);
            bVar12 = (byte)uVar10;
            uVar18 = CONCAT11(bVar12,bVar11);
            auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar16));
            auVar22._4_4_ = (uint)((byte)(uVar18 >> 1) & 1) * auVar25._4_4_;
            auVar22._0_4_ = (uint)(bVar11 & 1) * auVar25._0_4_;
            auVar22._8_4_ = (uint)((byte)(uVar18 >> 2) & 1) * auVar25._8_4_;
            auVar22._12_4_ = (uint)((byte)(uVar18 >> 3) & 1) * auVar25._12_4_;
            auVar22._16_4_ = (uint)((byte)(uVar18 >> 4) & 1) * auVar25._16_4_;
            auVar22._20_4_ = (uint)((byte)(uVar18 >> 5) & 1) * auVar25._20_4_;
            auVar22._24_4_ = (uint)((byte)(uVar18 >> 6) & 1) * auVar25._24_4_;
            auVar22._28_4_ = (uint)((byte)(uVar18 >> 7) & 1) * auVar25._28_4_;
            auVar22._32_4_ = (uint)(bVar12 & 1) * auVar25._32_4_;
            auVar22._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar25._36_4_;
            auVar22._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar25._40_4_;
            auVar22._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar25._44_4_;
            auVar22._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar25._48_4_;
            auVar22._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar25._52_4_;
            auVar22._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar25._56_4_;
            auVar22._60_4_ = (uint)(bVar12 >> 7) * auVar25._60_4_;
            uVar16 = uVar16 + 0x10;
            auVar25 = vpmulld_avx512f(auVar22,auVar28);
          } while (((ulong)uVar2 + 0xf & 0x1fffffff0) != uVar16);
          auVar23 = vmovdqa32_avx512f(auVar25);
          auVar24._0_4_ =
               (uint)(bVar11 & 1) * auVar23._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar28._0_4_;
          bVar7 = (bool)((byte)(uVar18 >> 1) & 1);
          auVar24._4_4_ = (uint)bVar7 * auVar23._4_4_ | (uint)!bVar7 * auVar28._4_4_;
          bVar7 = (bool)((byte)(uVar18 >> 2) & 1);
          auVar24._8_4_ = (uint)bVar7 * auVar23._8_4_ | (uint)!bVar7 * auVar28._8_4_;
          bVar7 = (bool)((byte)(uVar18 >> 3) & 1);
          auVar24._12_4_ = (uint)bVar7 * auVar23._12_4_ | (uint)!bVar7 * auVar28._12_4_;
          bVar7 = (bool)((byte)(uVar18 >> 4) & 1);
          auVar24._16_4_ = (uint)bVar7 * auVar23._16_4_ | (uint)!bVar7 * auVar28._16_4_;
          bVar7 = (bool)((byte)(uVar18 >> 5) & 1);
          auVar24._20_4_ = (uint)bVar7 * auVar23._20_4_ | (uint)!bVar7 * auVar28._20_4_;
          bVar7 = (bool)((byte)(uVar18 >> 6) & 1);
          auVar24._24_4_ = (uint)bVar7 * auVar23._24_4_ | (uint)!bVar7 * auVar28._24_4_;
          bVar7 = (bool)((byte)(uVar18 >> 7) & 1);
          auVar24._28_4_ = (uint)bVar7 * auVar23._28_4_ | (uint)!bVar7 * auVar28._28_4_;
          auVar24._32_4_ =
               (uint)(bVar12 & 1) * auVar23._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar28._32_4_;
          bVar7 = (bool)(bVar12 >> 1 & 1);
          auVar24._36_4_ = (uint)bVar7 * auVar23._36_4_ | (uint)!bVar7 * auVar28._36_4_;
          bVar7 = (bool)(bVar12 >> 2 & 1);
          auVar24._40_4_ = (uint)bVar7 * auVar23._40_4_ | (uint)!bVar7 * auVar28._40_4_;
          bVar7 = (bool)(bVar12 >> 3 & 1);
          auVar24._44_4_ = (uint)bVar7 * auVar23._44_4_ | (uint)!bVar7 * auVar28._44_4_;
          bVar7 = (bool)(bVar12 >> 4 & 1);
          auVar24._48_4_ = (uint)bVar7 * auVar23._48_4_ | (uint)!bVar7 * auVar28._48_4_;
          bVar7 = (bool)(bVar12 >> 5 & 1);
          auVar24._52_4_ = (uint)bVar7 * auVar23._52_4_ | (uint)!bVar7 * auVar28._52_4_;
          bVar7 = (bool)(bVar12 >> 6 & 1);
          auVar24._56_4_ = (uint)bVar7 * auVar23._56_4_ | (uint)!bVar7 * auVar28._56_4_;
          auVar24._60_4_ =
               (uint)(bVar12 >> 7) * auVar23._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar28._60_4_;
          auVar19 = vextracti64x4_avx512f(auVar24,1);
          auVar23 = vpmulld_avx512f(auVar24,ZEXT3264(auVar19));
          auVar8 = vpmulld_avx(auVar23._0_16_,auVar23._16_16_);
          auVar9 = vpshufd_avx(auVar8,0xee);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          auVar9 = vpshufd_avx(auVar8,0x55);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          iVar34 = auVar8._0_4_;
        }
        uVar3 = (dEdxi->d).d[0];
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar3;
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = dEdxi->v + (uVar14 % (dEdxi->d).bd) * iVar34;
        uVar13 = (dEdxi->d).d[1];
        if (uVar2 < 2) {
          uVar13 = 1;
        }
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)uVar13;
        if ((uVar3 != uVar4) || (uVar1 != uVar13)) {
          pcVar15 = 
          "static void Eigen::internal::Assignment<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>, Eigen::internal::add_assign_op<float, float>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>, Functor = Eigen::internal::add_assign_op<float, float>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
          ;
          goto LAB_00181304;
        }
        Eigen::internal::
        generic_product_impl<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>,Eigen::DenseShape,Eigen::DenseShape,8>
        ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                  (&local_70,&local_b0,
                   (Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&local_90);
        auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar17);
    }
  }
  else if (uVar14 == 1) {
    Tensor::operator*(&local_70,pTVar6);
    local_90.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = dEdf->v;
    local_90.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value = (long)(dEdf->d).d[0];
    uVar14 = 1;
    if (1 < (dEdf->d).nd) {
      uVar14 = (dEdf->d).d[1];
    }
    uVar14 = uVar14 * (dEdf->d).bd;
    local_90.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value = (long)uVar14;
    local_b0.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = local_70.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data;
    local_b0.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value =
         local_70.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value;
    local_b0.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value =
         local_70.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value;
    if (local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value !=
        local_90.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value) {
LAB_001812cd:
      pcVar15 = 
      "Eigen::Product<Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Rhs = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Option = 0]"
      ;
LAB_001812e2:
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar15);
    }
    local_50.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = dEdxi->v;
    local_50.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value = (long)(dEdxi->d).d[0];
    uVar17 = 1;
    if (1 < (dEdxi->d).nd) {
      uVar17 = (dEdxi->d).d[1];
    }
    uVar17 = uVar17 * (dEdxi->d).bd;
    local_50.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value = (long)uVar17;
    if ((local_70.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value !=
         local_50.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value) || (uVar14 != uVar17)) {
LAB_001812ef:
      pcVar15 = 
      "static void Eigen::internal::Assignment<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Product<Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::internal::add_assign_op<float, float>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Product<Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::add_assign_op<float, float>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
      ;
LAB_00181304:
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/ProductEvaluators.h",0xa1,pcVar15);
    }
    Eigen::internal::
    generic_product_impl<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
              (&local_50,
               (Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                *)&local_b0,&local_90);
  }
  else if (0 < (int)uVar17) {
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar14 = 0;
    do {
      iVar34 = 1;
      pTVar6 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar2 = (pTVar6->d).nd;
      if ((ulong)uVar2 != 0) {
        auVar25 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar26 = vpbroadcastq_avx512f();
        uVar16 = 0;
        do {
          auVar27 = vpbroadcastq_avx512f();
          auVar28 = vmovdqa64_avx512f(auVar25);
          auVar25 = vporq_avx512f(auVar27,auVar23);
          auVar27 = vporq_avx512f(auVar27,auVar24);
          uVar10 = vpcmpuq_avx512f(auVar27,auVar26,2);
          bVar11 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512f(auVar25,auVar26,2);
          bVar12 = (byte)uVar10;
          uVar18 = CONCAT11(bVar12,bVar11);
          auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar6->d).d + uVar16));
          auVar29._4_4_ = (uint)((byte)(uVar18 >> 1) & 1) * auVar25._4_4_;
          auVar29._0_4_ = (uint)(bVar11 & 1) * auVar25._0_4_;
          auVar29._8_4_ = (uint)((byte)(uVar18 >> 2) & 1) * auVar25._8_4_;
          auVar29._12_4_ = (uint)((byte)(uVar18 >> 3) & 1) * auVar25._12_4_;
          auVar29._16_4_ = (uint)((byte)(uVar18 >> 4) & 1) * auVar25._16_4_;
          auVar29._20_4_ = (uint)((byte)(uVar18 >> 5) & 1) * auVar25._20_4_;
          auVar29._24_4_ = (uint)((byte)(uVar18 >> 6) & 1) * auVar25._24_4_;
          auVar29._28_4_ = (uint)((byte)(uVar18 >> 7) & 1) * auVar25._28_4_;
          auVar29._32_4_ = (uint)(bVar12 & 1) * auVar25._32_4_;
          auVar29._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar25._36_4_;
          auVar29._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar25._40_4_;
          auVar29._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar25._44_4_;
          auVar29._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar25._48_4_;
          auVar29._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar25._52_4_;
          auVar29._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar25._56_4_;
          auVar29._60_4_ = (uint)(bVar12 >> 7) * auVar25._60_4_;
          uVar16 = uVar16 + 0x10;
          auVar25 = vpmulld_avx512f(auVar29,auVar28);
        } while (((ulong)uVar2 + 0xf & 0x1fffffff0) != uVar16);
        auVar25 = vmovdqa32_avx512f(auVar25);
        auVar30._0_4_ =
             (uint)(bVar11 & 1) * auVar25._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar28._0_4_;
        bVar7 = (bool)((byte)(uVar18 >> 1) & 1);
        auVar30._4_4_ = (uint)bVar7 * auVar25._4_4_ | (uint)!bVar7 * auVar28._4_4_;
        bVar7 = (bool)((byte)(uVar18 >> 2) & 1);
        auVar30._8_4_ = (uint)bVar7 * auVar25._8_4_ | (uint)!bVar7 * auVar28._8_4_;
        bVar7 = (bool)((byte)(uVar18 >> 3) & 1);
        auVar30._12_4_ = (uint)bVar7 * auVar25._12_4_ | (uint)!bVar7 * auVar28._12_4_;
        bVar7 = (bool)((byte)(uVar18 >> 4) & 1);
        auVar30._16_4_ = (uint)bVar7 * auVar25._16_4_ | (uint)!bVar7 * auVar28._16_4_;
        bVar7 = (bool)((byte)(uVar18 >> 5) & 1);
        auVar30._20_4_ = (uint)bVar7 * auVar25._20_4_ | (uint)!bVar7 * auVar28._20_4_;
        bVar7 = (bool)((byte)(uVar18 >> 6) & 1);
        auVar30._24_4_ = (uint)bVar7 * auVar25._24_4_ | (uint)!bVar7 * auVar28._24_4_;
        bVar7 = (bool)((byte)(uVar18 >> 7) & 1);
        auVar30._28_4_ = (uint)bVar7 * auVar25._28_4_ | (uint)!bVar7 * auVar28._28_4_;
        auVar30._32_4_ =
             (uint)(bVar12 & 1) * auVar25._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar28._32_4_;
        bVar7 = (bool)(bVar12 >> 1 & 1);
        auVar30._36_4_ = (uint)bVar7 * auVar25._36_4_ | (uint)!bVar7 * auVar28._36_4_;
        bVar7 = (bool)(bVar12 >> 2 & 1);
        auVar30._40_4_ = (uint)bVar7 * auVar25._40_4_ | (uint)!bVar7 * auVar28._40_4_;
        bVar7 = (bool)(bVar12 >> 3 & 1);
        auVar30._44_4_ = (uint)bVar7 * auVar25._44_4_ | (uint)!bVar7 * auVar28._44_4_;
        bVar7 = (bool)(bVar12 >> 4 & 1);
        auVar30._48_4_ = (uint)bVar7 * auVar25._48_4_ | (uint)!bVar7 * auVar28._48_4_;
        bVar7 = (bool)(bVar12 >> 5 & 1);
        auVar30._52_4_ = (uint)bVar7 * auVar25._52_4_ | (uint)!bVar7 * auVar28._52_4_;
        bVar7 = (bool)(bVar12 >> 6 & 1);
        auVar30._56_4_ = (uint)bVar7 * auVar25._56_4_ | (uint)!bVar7 * auVar28._56_4_;
        auVar30._60_4_ =
             (uint)(bVar12 >> 7) * auVar25._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar28._60_4_;
        auVar19 = vextracti64x4_avx512f(auVar30,1);
        auVar25 = vpmulld_avx512f(auVar30,ZEXT3264(auVar19));
        auVar8 = vpmulld_avx(auVar25._0_16_,auVar25._16_16_);
        auVar9 = vpshufd_avx(auVar8,0xee);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        auVar9 = vpshufd_avx(auVar8,0x55);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        iVar34 = auVar8._0_4_;
      }
      uVar3 = (dEdf->d).nd;
      iVar35 = 1;
      local_b0.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = (long)(pTVar6->d).d[1];
      if (uVar2 < 2) {
        local_b0.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = 1;
      }
      if ((ulong)uVar3 != 0) {
        auVar25 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar26 = vpbroadcastq_avx512f();
        uVar16 = 0;
        do {
          auVar27 = vpbroadcastq_avx512f();
          auVar28 = vmovdqa64_avx512f(auVar25);
          auVar25 = vporq_avx512f(auVar27,auVar23);
          auVar27 = vporq_avx512f(auVar27,auVar24);
          uVar10 = vpcmpuq_avx512f(auVar27,auVar26,2);
          bVar11 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512f(auVar25,auVar26,2);
          bVar12 = (byte)uVar10;
          uVar18 = CONCAT11(bVar12,bVar11);
          auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar16));
          auVar31._4_4_ = (uint)((byte)(uVar18 >> 1) & 1) * auVar25._4_4_;
          auVar31._0_4_ = (uint)(bVar11 & 1) * auVar25._0_4_;
          auVar31._8_4_ = (uint)((byte)(uVar18 >> 2) & 1) * auVar25._8_4_;
          auVar31._12_4_ = (uint)((byte)(uVar18 >> 3) & 1) * auVar25._12_4_;
          auVar31._16_4_ = (uint)((byte)(uVar18 >> 4) & 1) * auVar25._16_4_;
          auVar31._20_4_ = (uint)((byte)(uVar18 >> 5) & 1) * auVar25._20_4_;
          auVar31._24_4_ = (uint)((byte)(uVar18 >> 6) & 1) * auVar25._24_4_;
          auVar31._28_4_ = (uint)((byte)(uVar18 >> 7) & 1) * auVar25._28_4_;
          auVar31._32_4_ = (uint)(bVar12 & 1) * auVar25._32_4_;
          auVar31._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar25._36_4_;
          auVar31._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar25._40_4_;
          auVar31._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar25._44_4_;
          auVar31._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar25._48_4_;
          auVar31._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar25._52_4_;
          auVar31._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar25._56_4_;
          auVar31._60_4_ = (uint)(bVar12 >> 7) * auVar25._60_4_;
          uVar16 = uVar16 + 0x10;
          auVar25 = vpmulld_avx512f(auVar31,auVar28);
        } while (((ulong)uVar3 + 0xf & 0x1fffffff0) != uVar16);
        auVar25 = vmovdqa32_avx512f(auVar25);
        auVar32._0_4_ =
             (uint)(bVar11 & 1) * auVar25._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar28._0_4_;
        bVar7 = (bool)((byte)(uVar18 >> 1) & 1);
        auVar32._4_4_ = (uint)bVar7 * auVar25._4_4_ | (uint)!bVar7 * auVar28._4_4_;
        bVar7 = (bool)((byte)(uVar18 >> 2) & 1);
        auVar32._8_4_ = (uint)bVar7 * auVar25._8_4_ | (uint)!bVar7 * auVar28._8_4_;
        bVar7 = (bool)((byte)(uVar18 >> 3) & 1);
        auVar32._12_4_ = (uint)bVar7 * auVar25._12_4_ | (uint)!bVar7 * auVar28._12_4_;
        bVar7 = (bool)((byte)(uVar18 >> 4) & 1);
        auVar32._16_4_ = (uint)bVar7 * auVar25._16_4_ | (uint)!bVar7 * auVar28._16_4_;
        bVar7 = (bool)((byte)(uVar18 >> 5) & 1);
        auVar32._20_4_ = (uint)bVar7 * auVar25._20_4_ | (uint)!bVar7 * auVar28._20_4_;
        bVar7 = (bool)((byte)(uVar18 >> 6) & 1);
        auVar32._24_4_ = (uint)bVar7 * auVar25._24_4_ | (uint)!bVar7 * auVar28._24_4_;
        bVar7 = (bool)((byte)(uVar18 >> 7) & 1);
        auVar32._28_4_ = (uint)bVar7 * auVar25._28_4_ | (uint)!bVar7 * auVar28._28_4_;
        auVar32._32_4_ =
             (uint)(bVar12 & 1) * auVar25._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar28._32_4_;
        bVar7 = (bool)(bVar12 >> 1 & 1);
        auVar32._36_4_ = (uint)bVar7 * auVar25._36_4_ | (uint)!bVar7 * auVar28._36_4_;
        bVar7 = (bool)(bVar12 >> 2 & 1);
        auVar32._40_4_ = (uint)bVar7 * auVar25._40_4_ | (uint)!bVar7 * auVar28._40_4_;
        bVar7 = (bool)(bVar12 >> 3 & 1);
        auVar32._44_4_ = (uint)bVar7 * auVar25._44_4_ | (uint)!bVar7 * auVar28._44_4_;
        bVar7 = (bool)(bVar12 >> 4 & 1);
        auVar32._48_4_ = (uint)bVar7 * auVar25._48_4_ | (uint)!bVar7 * auVar28._48_4_;
        bVar7 = (bool)(bVar12 >> 5 & 1);
        auVar32._52_4_ = (uint)bVar7 * auVar25._52_4_ | (uint)!bVar7 * auVar28._52_4_;
        bVar7 = (bool)(bVar12 >> 6 & 1);
        auVar32._56_4_ = (uint)bVar7 * auVar25._56_4_ | (uint)!bVar7 * auVar28._56_4_;
        auVar32._60_4_ =
             (uint)(bVar12 >> 7) * auVar25._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar28._60_4_;
        auVar19 = vextracti64x4_avx512f(auVar32,1);
        auVar25 = vpmulld_avx512f(auVar32,ZEXT3264(auVar19));
        auVar8 = vpmulld_avx(auVar25._0_16_,auVar25._16_16_);
        auVar9 = vpshufd_avx(auVar8,0xee);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        auVar9 = vpshufd_avx(auVar8,0x55);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        iVar35 = auVar8._0_4_;
      }
      uVar2 = (pTVar6->d).d[0];
      local_b0.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)uVar2;
      local_b0.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = pTVar6->v + (uVar14 % (pTVar6->d).bd) * iVar34;
      local_90.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dEdf->v + (uVar14 % (dEdf->d).bd) * iVar35;
      uVar4 = (dEdf->d).d[0];
      local_90.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)uVar4;
      local_90.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = (long)(dEdf->d).d[1];
      if (uVar3 < 2) {
        local_90.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = 1;
      }
      if (uVar2 != uVar4) goto LAB_001812cd;
      uVar2 = (dEdxi->d).nd;
      if ((ulong)uVar2 == 0) {
        iVar34 = 1;
      }
      else {
        auVar25 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar26 = vpbroadcastq_avx512f();
        uVar16 = 0;
        do {
          auVar27 = vpbroadcastq_avx512f();
          auVar28 = vmovdqa64_avx512f(auVar25);
          auVar25 = vporq_avx512f(auVar27,auVar23);
          auVar27 = vporq_avx512f(auVar27,auVar24);
          uVar10 = vpcmpuq_avx512f(auVar27,auVar26,2);
          bVar11 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512f(auVar25,auVar26,2);
          bVar12 = (byte)uVar10;
          uVar18 = CONCAT11(bVar12,bVar11);
          auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar16));
          auVar33._4_4_ = (uint)((byte)(uVar18 >> 1) & 1) * auVar25._4_4_;
          auVar33._0_4_ = (uint)(bVar11 & 1) * auVar25._0_4_;
          auVar33._8_4_ = (uint)((byte)(uVar18 >> 2) & 1) * auVar25._8_4_;
          auVar33._12_4_ = (uint)((byte)(uVar18 >> 3) & 1) * auVar25._12_4_;
          auVar33._16_4_ = (uint)((byte)(uVar18 >> 4) & 1) * auVar25._16_4_;
          auVar33._20_4_ = (uint)((byte)(uVar18 >> 5) & 1) * auVar25._20_4_;
          auVar33._24_4_ = (uint)((byte)(uVar18 >> 6) & 1) * auVar25._24_4_;
          auVar33._28_4_ = (uint)((byte)(uVar18 >> 7) & 1) * auVar25._28_4_;
          auVar33._32_4_ = (uint)(bVar12 & 1) * auVar25._32_4_;
          auVar33._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar25._36_4_;
          auVar33._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar25._40_4_;
          auVar33._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar25._44_4_;
          auVar33._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar25._48_4_;
          auVar33._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar25._52_4_;
          auVar33._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar25._56_4_;
          auVar33._60_4_ = (uint)(bVar12 >> 7) * auVar25._60_4_;
          uVar16 = uVar16 + 0x10;
          auVar25 = vpmulld_avx512f(auVar33,auVar28);
        } while (((ulong)uVar2 + 0xf & 0x1fffffff0) != uVar16);
        auVar23 = vmovdqa32_avx512f(auVar25);
        auVar25._0_4_ =
             (uint)(bVar11 & 1) * auVar23._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar28._0_4_;
        bVar7 = (bool)((byte)(uVar18 >> 1) & 1);
        auVar25._4_4_ = (uint)bVar7 * auVar23._4_4_ | (uint)!bVar7 * auVar28._4_4_;
        bVar7 = (bool)((byte)(uVar18 >> 2) & 1);
        auVar25._8_4_ = (uint)bVar7 * auVar23._8_4_ | (uint)!bVar7 * auVar28._8_4_;
        bVar7 = (bool)((byte)(uVar18 >> 3) & 1);
        auVar25._12_4_ = (uint)bVar7 * auVar23._12_4_ | (uint)!bVar7 * auVar28._12_4_;
        bVar7 = (bool)((byte)(uVar18 >> 4) & 1);
        auVar25._16_4_ = (uint)bVar7 * auVar23._16_4_ | (uint)!bVar7 * auVar28._16_4_;
        bVar7 = (bool)((byte)(uVar18 >> 5) & 1);
        auVar25._20_4_ = (uint)bVar7 * auVar23._20_4_ | (uint)!bVar7 * auVar28._20_4_;
        bVar7 = (bool)((byte)(uVar18 >> 6) & 1);
        auVar25._24_4_ = (uint)bVar7 * auVar23._24_4_ | (uint)!bVar7 * auVar28._24_4_;
        bVar7 = (bool)((byte)(uVar18 >> 7) & 1);
        auVar25._28_4_ = (uint)bVar7 * auVar23._28_4_ | (uint)!bVar7 * auVar28._28_4_;
        auVar25._32_4_ =
             (uint)(bVar12 & 1) * auVar23._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar28._32_4_;
        bVar7 = (bool)(bVar12 >> 1 & 1);
        auVar25._36_4_ = (uint)bVar7 * auVar23._36_4_ | (uint)!bVar7 * auVar28._36_4_;
        bVar7 = (bool)(bVar12 >> 2 & 1);
        auVar25._40_4_ = (uint)bVar7 * auVar23._40_4_ | (uint)!bVar7 * auVar28._40_4_;
        bVar7 = (bool)(bVar12 >> 3 & 1);
        auVar25._44_4_ = (uint)bVar7 * auVar23._44_4_ | (uint)!bVar7 * auVar28._44_4_;
        bVar7 = (bool)(bVar12 >> 4 & 1);
        auVar25._48_4_ = (uint)bVar7 * auVar23._48_4_ | (uint)!bVar7 * auVar28._48_4_;
        bVar7 = (bool)(bVar12 >> 5 & 1);
        auVar25._52_4_ = (uint)bVar7 * auVar23._52_4_ | (uint)!bVar7 * auVar28._52_4_;
        bVar7 = (bool)(bVar12 >> 6 & 1);
        auVar25._56_4_ = (uint)bVar7 * auVar23._56_4_ | (uint)!bVar7 * auVar28._56_4_;
        auVar25._60_4_ =
             (uint)(bVar12 >> 7) * auVar23._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar28._60_4_;
        auVar19 = vextracti64x4_avx512f(auVar25,1);
        auVar23 = vpmulld_avx512f(auVar25,ZEXT3264(auVar19));
        auVar8 = vpmulld_avx(auVar23._0_16_,auVar23._16_16_);
        auVar9 = vpshufd_avx(auVar8,0xee);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        auVar9 = vpshufd_avx(auVar8,0x55);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        iVar34 = auVar8._0_4_;
      }
      uVar3 = (dEdxi->d).d[0];
      local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)uVar3;
      local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dEdxi->v + (uVar14 % (dEdxi->d).bd) * iVar34;
      uVar4 = (dEdxi->d).d[1];
      if (uVar2 < 2) {
        uVar4 = 1;
      }
      local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = (long)uVar4;
      if ((uVar3 != (uint)local_b0.
                          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                          .
                          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_cols.m_value) ||
         ((uint)local_90.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value != uVar4)) goto LAB_001812ef;
      Eigen::internal::
      generic_product_impl<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                (&local_70,
                 (Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_b0,&local_90);
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar17);
  }
  return;
}

Assistant:

void MatrixMultiply::backward_impl(const vector<const Tensor*>& xs,
                                const Tensor& fx,
                                const Tensor& dEdf,
                                unsigned i,
                                Tensor& dEdxi) const {
  assert(i < 2);
  int max_b = max(xs[0]->d.bd, xs[1]->d.bd);
#if HAVE_CUDA
  if (i == 0) {
    for(int b = 0; b < max_b; ++b)
      CUBLAS_CHECK(cublasSgemm(cublas_handle, CUBLAS_OP_N, CUBLAS_OP_T,
            dEdxi.d.rows(), dEdxi.d.cols(), dEdf.d.cols(),
            kSCALAR_ONE,
            dEdf.batch_ptr(b), dEdf.d.rows(),
            xs[1]->batch_ptr(b), xs[1]->d.rows(),
            kSCALAR_ONE, dEdxi.batch_ptr(b), dEdxi.d.rows()));
  } else {
    // TODO: Fix this to share
    for(int b = 0; b < max_b; ++b)
      CUBLAS_CHECK(cublasSgemm(cublas_handle, CUBLAS_OP_T, CUBLAS_OP_N,
            dEdxi.d.rows(), dEdxi.d.cols(), xs[0]->d.rows(),
            kSCALAR_ONE,
            xs[0]->batch_ptr(b), xs[0]->d.rows(),
            dEdf.batch_ptr(b), dEdf.d.rows(),
            kSCALAR_ONE, dEdxi.batch_ptr(b), dEdxi.d.rows()));
  }
#else
  if (i == 0) {
    for(int b = 0; b < max_b; ++b)
      dEdxi.batch_matrix(b).noalias() += dEdf.batch_matrix(b) * xs[1]->batch_matrix(b).transpose();
  } else {
    if(xs[0]->d.bd == 1) {
      dEdxi.colbatch_matrix().noalias() += (**xs[0]).transpose() * dEdf.colbatch_matrix();
    } else {
      for(int b = 0; b < max_b; ++b)
        dEdxi.batch_matrix(b).noalias() += xs[0]->batch_matrix(b).transpose() * dEdf.batch_matrix(b);
    }
  }
#endif
}